

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::splitFacesFromHorizontalCross<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  int iVar1;
  CubemapFace<unsigned_char> *pCVar2;
  uchar *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int i;
  long lVar8;
  long lVar9;
  
  iVar1 = (int)(_width >> 2);
  iVar6 = (int)(_height / 3);
  lVar8 = 0;
  do {
    pCVar2 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar2->id = 0;
    pCVar2->width = 0;
    pCVar2->height = 0;
    pCVar2->currentOffset = 0;
    pCVar2->data = (uchar *)0x0;
    _faces[lVar8] = pCVar2;
    pCVar2->id = (int)lVar8;
    puVar3 = (uchar *)operator_new__((long)iVar6 * (long)iVar1 * _channels);
    pCVar2->data = puVar3;
    pCVar2->width = iVar1;
    pCVar2->height = iVar6;
    pCVar2->currentOffset = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  if (_height != 0) {
    iVar1 = iVar1 * (int)_channels;
    uVar4 = 0;
    do {
      uVar7 = 0;
      lVar8 = 2;
      do {
        iVar5 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                     (long)iVar6);
        lVar9 = lVar8 + -1;
        if (lVar8 == 0 && iVar5 == 1) {
          pCVar2 = *_faces;
        }
        else {
          pCVar2 = (CubemapFace<unsigned_char> *)0x0;
        }
        if (lVar8 == 2 && iVar5 == 1) {
          pCVar2 = _faces[1];
        }
        if (lVar8 == 1 && iVar5 == 0) {
          pCVar2 = _faces[2];
        }
        if (iVar5 == 2 && lVar8 == 1) {
          pCVar2 = _faces[3];
        }
        if (iVar5 == 1 && lVar8 == 1) {
          pCVar2 = _faces[4];
        }
        if (lVar8 == -1 && iVar5 == 1) {
          pCVar2 = _faces[5];
        }
        if (pCVar2 != (CubemapFace<unsigned_char> *)0x0) {
          memcpy(pCVar2->data + pCVar2->currentOffset,
                 _data + ((long)(((uVar7 & 0xffffffff) + uVar4 * _width) * (_channels << 0x20)) >>
                         0x20),(long)iVar1);
          pCVar2->currentOffset = pCVar2->currentOffset + iVar1;
        }
        uVar7 = uVar7 + (_width >> 2);
        lVar8 = lVar9;
      } while (lVar9 != -2);
      uVar4 = uVar4 + 1;
    } while (uVar4 != _height);
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}